

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O2

void __thiscall Regular::Regular(Regular *this,Time *time,string *name,string *type)

{
  long lVar1;
  allocator<char> local_31;
  string local_30;
  
  StochasticEventGenerator::StochasticEventGenerator
            (&this->super_StochasticEventGenerator,time,name,type);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__StochasticProcess_00156aa0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__Regular_00156b38;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__Regular_00156b80;
  lVar1 = (long)(0.2 / ((this->super_StochasticEventGenerator).super_StochasticVariable.
                        super_StochasticProcess.super_TimeDependent.xTime)->dt);
  this->regularInterval = lVar1;
  this->regularCount = lVar1;
  std::__cxx11::string::assign
            ((char *)&(this->super_StochasticEventGenerator).super_StochasticVariable.
                      super_StochasticProcess.stochDescription);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"rate",&local_31);
  Parametric::addParameter((Parametric *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Regular::Regular(Time *time, const string& name, const string& type)
: StochasticEventGenerator(time, name, type)
{
	regularInterval = long(1.0 / 5.0 / xTime->dt);
	regularCount = regularInterval;
	stochDescription = "regular counting process";
	addParameter("rate");
}